

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvs.c
# Opt level: O1

LispPTR values(int arg_count,LispPTR *args)

{
  byte bVar1;
  FX2 *pFVar2;
  ByteCode *pBVar3;
  uint uVar4;
  LispPTR cons_cdr;
  FX2 *frame;
  ulong uVar5;
  FX2 *returner;
  FX2 *pFVar6;
  int unbind_count;
  ByteCode *pBVar7;
  fnhead *pfVar8;
  long lVar9;
  
  pFVar6 = (FX2 *)(MachineState.pvar + -10);
  unbind_count = 0;
  pFVar2 = pFVar6;
  returner = (FX2 *)0x0;
  do {
    frame = pFVar2;
    if (frame == pFVar6) {
      pBVar7 = MachineState.currentpc + 3;
      pfVar8 = MachineState.currentfunc;
    }
    else {
      uVar5 = (ulong)(frame->fnheader & 0xfffffff);
      if ((frame->fnheader & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar5);
      }
      pBVar7 = (ByteCode *)((long)&((fnhead *)(Lisp_world + uVar5))->na + (ulong)frame->pc);
      pfVar8 = (fnhead *)(Lisp_world + uVar5);
    }
LAB_0012ef0a:
    bVar1 = *(byte *)((ulong)pBVar7 ^ 3);
    if (bVar1 < 0x3f) {
      if (bVar1 == 9) {
        if (MVLIST_index ==
            ((uint)*(byte *)((ulong)(pBVar7 + 4) ^ 3) |
            (uint)*(byte *)((ulong)(pBVar7 + 3) ^ 3) << 8 |
            (uint)*(byte *)((ulong)(pBVar7 + 2) ^ 3) << 0x10 |
            (uint)*(byte *)((ulong)(pBVar7 + 1) ^ 3) << 0x18)) {
          if (0 < unbind_count) {
            simulate_unbind(frame,unbind_count,returner);
          }
          pBVar3 = pBVar7 + 2;
          if (frame != pFVar6) {
            frame->pc = ((short)pBVar7 - (short)pfVar8) + 5;
            pBVar3 = MachineState.currentpc;
          }
          MachineState.currentpc = pBVar3;
          if (arg_count < 1) {
            return 0;
          }
          lVar9 = (ulong)(uint)arg_count + 1;
          cons_cdr = 0;
          do {
            cons_cdr = cons(args[lVar9 + -2],cons_cdr);
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
          return cons_cdr;
        }
        goto LAB_0012f04f;
      }
      if (bVar1 == 0x10) goto LAB_0012efb4;
      if (bVar1 == 0x12) {
        pBVar7 = pBVar7 + 1;
        unbind_count = unbind_count + 1;
        goto LAB_0012ef0a;
      }
LAB_0012ef30:
      if (-0x71 < (char)bVar1) {
LAB_0012f04f:
        if (arg_count < 1) {
          return 0;
        }
        return *args;
      }
      uVar5 = (ulong)(bVar1 + 2 & 0x1f);
LAB_0012ef9a:
      pBVar7 = pBVar7 + uVar5;
      goto LAB_0012ef0a;
    }
    if (bVar1 == 0xb0) {
      bVar1 = *(byte *)((ulong)(pBVar7 + 1) ^ 3);
      uVar5 = (ulong)bVar1 - 0x100;
      if (-1 < (char)bVar1) {
        uVar5 = (ulong)bVar1;
      }
      goto LAB_0012ef9a;
    }
    if (bVar1 == 0xb1) {
      bVar1 = *(byte *)((ulong)(pBVar7 + 1) ^ 3);
      uVar4 = (uint)bVar1 * 0x100 + -0x10000 + (uint)*(byte *)((ulong)(pBVar7 + 2) ^ 3);
      if (-1 < (char)bVar1) {
        uVar4 = (uint)CONCAT11(bVar1,*(byte *)((ulong)(pBVar7 + 2) ^ 3));
      }
      uVar5 = (long)(int)uVar4;
      goto LAB_0012ef9a;
    }
    if (bVar1 != 0x3f) goto LAB_0012ef30;
LAB_0012efb4:
    pFVar2 = (FX2 *)(Stackspace +
                    (*(ushort *)((long)&frame->alink + (ulong)((*(uint *)frame & 1) << 4)) - 10));
    returner = frame;
  } while( true );
}

Assistant:

LispPTR values(int arg_count, LispPTR *args) {
  FX2 *caller, *prevcaller = 0, *immediate_caller = 0;
  ByteCode *pc;
  int unbind_count = 0;
  struct fnhead *fnhead;
  short opcode;

  caller = (FX2 *)CURRENTFX;
  immediate_caller = caller;

newframe:
  if (caller == immediate_caller) {
    fnhead = (struct fnhead *)FuncObj;
    pc = (ByteCode *)PC + 3; /* to skip the miscn opcode we're in now */
  } else {
    fnhead = (struct fnhead *)NativeAligned4FromLAddr(POINTERMASK & SWA_FNHEAD((int)caller->fnheader));
    pc = (ByteCode *)fnhead + (caller->pc);
  }
#ifdef RESWAPPEDCODESTREAM
  if (!fnhead->byteswapped) {
    byte_swap_code_block(fnhead);
    fnhead->byteswapped = 1;
  }
#endif /* RESWAPPEDCODESTREAM */

newpc:
  opcode = (short)((unsigned char)GETBYTE((char *)pc));
  switch (opcode) {
    case opc_RETURN:
    case opc_SLRETURN:
      prevcaller = caller;
      caller = (FX2 *)(Stackspace + (unsigned)(GETCLINK(caller)));
      goto newframe;

    case opc_FN1:
      if (MVLIST_index == Get_code_AtomNo(pc + 1)) {
        if (unbind_count > 0) simulate_unbind(caller, unbind_count, prevcaller);
#ifndef BIGATOMS
        /* would add 3 to  PC, but miscn return code does.*/
        if (caller == immediate_caller) PC = pc;
#else
        /* BUT 3's not enough for big atoms, so add diff between FN op size & MISCN op size */
        if (caller == immediate_caller) PC = pc + (FN_OPCODE_SIZE - 3);
#endif /* BIGATOMS */

        else
          caller->pc = (UNSIGNED)pc + FN_OPCODE_SIZE - (UNSIGNED)fnhead;
        return (make_value_list(arg_count, args));
      }
      break;

    case opc_UNBIND:
      pc += 1;
      unbind_count += 1;
      goto newpc;

    case opc_JUMPX: {
      short displacement;
      displacement = (short)(GETBYTE((char *)pc + 1));
      if (displacement >= 128) displacement -= 256;
      pc += displacement;
      goto newpc;
    }

    case opc_JUMPXX: {
      int displacement;
      displacement = (int)Get_code_DLword(pc + 1);
      if (displacement >= 32768) displacement -= 65536;
      pc += displacement;
      goto newpc;
    }
    default:
      if ((opcode >= opc_JUMP) && (opcode < opc_FJUMP)) {
        pc += 2 + opcode - opc_JUMP;
        goto newpc;
      }
  }

  /*****************************************/
  /* Default case:  Return a single value. */
  /*****************************************/

  if (arg_count > 0)
    return (args[0]);
  else
    return (NIL_PTR);
}